

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O2

ktx_error_code_e
ktxVulkanTexture_Destruct_WithSuballocator
          (ktxVulkanTexture *vkTexture,VkDevice device,VkAllocationCallbacks *pAllocator,
          ktxVulkanTexture_subAllocatorCallbacks *subAllocatorCallbacks)

{
  if (subAllocatorCallbacks == (ktxVulkanTexture_subAllocatorCallbacks *)0x0) {
    (*vkTexture->vkDestroyImage)(device,vkTexture->image,pAllocator);
    (*vkTexture->vkFreeMemory)(device,vkTexture->deviceMemory,pAllocator);
  }
  else {
    if (subAllocatorCallbacks->allocMemFuncPtr == (ktxVulkanTexture_subAllocatorAllocMemFuncPtr)0x0)
    {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindBufferFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindBufferFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->bindImageFuncPtr ==
        (ktxVulkanTexture_subAllocatorBindImageFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryMapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryMapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->memoryUnmapFuncPtr ==
        (ktxVulkanTexture_subAllocatorMemoryUnmapFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    if (subAllocatorCallbacks->freeMemFuncPtr == (ktxVulkanTexture_subAllocatorFreeMemFuncPtr)0x0) {
      return KTX_INVALID_VALUE;
    }
    (*vkTexture->vkDestroyImage)(device,vkTexture->image,pAllocator);
    (*subAllocatorCallbacks->freeMemFuncPtr)(vkTexture->allocationId);
  }
  return KTX_SUCCESS;
}

Assistant:

ktx_error_code_e
ktxVulkanTexture_Destruct_WithSuballocator(ktxVulkanTexture* vkTexture, VkDevice device,
                                           const VkAllocationCallbacks* pAllocator,
                                           ktxVulkanTexture_subAllocatorCallbacks* subAllocatorCallbacks)
{
    ktx_bool_t useSuballocator = false;
    if (subAllocatorCallbacks) {
        if (subAllocatorCallbacks->allocMemFuncPtr &&
            subAllocatorCallbacks->bindBufferFuncPtr &&
            subAllocatorCallbacks->bindImageFuncPtr &&
            subAllocatorCallbacks->memoryMapFuncPtr &&
            subAllocatorCallbacks->memoryUnmapFuncPtr &&
            subAllocatorCallbacks->freeMemFuncPtr)
            useSuballocator = true;
        else
            return KTX_INVALID_VALUE;
    }

    vkTexture->vkDestroyImage(device, vkTexture->image, pAllocator);
    if (useSuballocator)
        subAllocatorCallbacks->freeMemFuncPtr(vkTexture->allocationId);
    else
        vkTexture->vkFreeMemory(device, vkTexture->deviceMemory, pAllocator);

    return KTX_SUCCESS;
}